

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O3

DdNode * Cudd_LargestCube(DdManager *manager,DdNode *f,int *length)

{
  int iVar1;
  int iVar2;
  st__table *visited;
  uint *key;
  uint uVar3;
  DdNode *pDVar4;
  ulong uVar5;
  DdNode *g;
  int iVar6;
  ulong uVar7;
  uint *key_00;
  uint *puVar8;
  cuddPathPair *rootPair;
  cuddPathPair *E_pair;
  cuddPathPair *T_pair;
  char *local_48;
  int *local_40;
  int *local_38;
  
  one = manager->one;
  zero = manager->zero;
  pDVar4 = (DdNode *)((ulong)one ^ 1);
  iVar1 = 1000000;
  if (zero != f && pDVar4 != f) {
    key_00 = (uint *)((ulong)f & 0xfffffffffffffffe);
    do {
      manager->reordered = 0;
      visited = st__init_table(st__ptrcmp,st__ptrhash);
      getLargest(f,visited);
      iVar1 = st__lookup(visited,(char *)key_00,&local_48);
      pDVar4 = one;
      if (iVar1 == 0) {
        return (DdNode *)0x0;
      }
      iVar1 = *(int *)(local_48 + ((uint)f * 4 & 4));
      uVar7 = (ulong)one & 0xfffffffffffffffe;
      iVar2 = *(int *)(uVar7 + 4);
      *(int *)(uVar7 + 4) = iVar2 + 1;
      g = pDVar4;
      puVar8 = key_00;
      iVar6 = iVar1;
      uVar3 = (uint)f;
      if (*key_00 != 0x7fffffff) {
        do {
          iVar6 = iVar6 + -1;
          uVar5 = *(ulong *)(puVar8 + 6) ^ 1;
          uVar7 = *(ulong *)(puVar8 + 4) ^ 1;
          if ((uVar3 & 1) == 0) {
            uVar5 = *(ulong *)(puVar8 + 6);
            uVar7 = *(ulong *)(puVar8 + 4);
          }
          key = (uint *)(uVar7 & 0xfffffffffffffffe);
          iVar2 = st__lookup(visited,(char *)key,(char **)&local_38);
          uVar3 = (uint)uVar5;
          if (iVar2 == 0) {
LAB_00795419:
            pDVar4 = (DdNode *)0x0;
            goto LAB_00795431;
          }
          if ((uVar7 & 1) != 0) {
            if (iVar6 != local_38[1]) goto LAB_007952e6;
LAB_00795320:
            pDVar4 = cuddBddAndRecur(manager,manager->vars[*puVar8],g);
            uVar3 = (uint)uVar7;
            if (pDVar4 != (DdNode *)0x0) goto LAB_00795390;
LAB_0079540f:
            Cudd_RecursiveDeref(manager,g);
            goto LAB_00795419;
          }
          if (iVar6 == *local_38) goto LAB_00795320;
LAB_007952e6:
          key = (uint *)(uVar5 & 0xfffffffffffffffe);
          iVar2 = st__lookup(visited,(char *)key,(char **)&local_40);
          if (iVar2 == 0) goto LAB_00795419;
          if ((uVar5 & 1) == 0) {
            iVar2 = *local_40;
          }
          else {
            iVar2 = local_40[1];
          }
          if (iVar6 != iVar2) {
            fwrite("We shouldn\'t be here!\n",0x16,1,(FILE *)manager->err);
            manager->errorCode = CUDD_INTERNAL_ERROR;
            goto LAB_00795419;
          }
          pDVar4 = cuddBddAndRecur(manager,(DdNode *)((ulong)manager->vars[*puVar8] ^ 1),g);
          if (pDVar4 == (DdNode *)0x0) goto LAB_0079540f;
LAB_00795390:
          uVar7 = (ulong)pDVar4 & 0xfffffffffffffffe;
          *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
          Cudd_RecursiveDeref(manager,g);
          g = pDVar4;
          puVar8 = key;
        } while (*key != 0x7fffffff);
        iVar2 = *(int *)(uVar7 + 4) + -1;
      }
      *(int *)(uVar7 + 4) = iVar2;
LAB_00795431:
      st__foreach(visited,freePathPair,(char *)0x0);
      st__free_table(visited);
    } while (manager->reordered == 1);
  }
  *length = iVar1;
  return pDVar4;
}

Assistant:

DdNode *
Cudd_LargestCube(
  DdManager * manager,
  DdNode * f,
  int * length)
{
    register    DdNode  *F;
    st__table    *visited;
    DdNode      *sol;
    cuddPathPair *rootPair;
    int         complement, cost;

    one = DD_ONE(manager);
    zero = DD_ZERO(manager);

    if (f == Cudd_Not(one) || f == zero) {
        *length = DD_BIGGY;
        return(Cudd_Not(one));
    }
    /* From this point on, a path exists. */

    do {
        manager->reordered = 0;

        /* Initialize visited table. */
        visited = st__init_table( st__ptrcmp, st__ptrhash);

        /* Now get the length of the shortest path(s) from f to 1. */
        (void) getLargest(f, visited);

        complement = Cudd_IsComplement(f);

        F = Cudd_Regular(f);

        if (! st__lookup(visited, (const char *)F, (char **)&rootPair)) return(NULL);

        if (complement) {
          cost = rootPair->neg;
        } else {
          cost = rootPair->pos;
        }

        /* Recover an actual shortest path. */
        sol = getCube(manager,visited,f,cost);

        st__foreach(visited, freePathPair, NULL);
        st__free_table(visited);

    } while (manager->reordered == 1);

    *length = cost;
    return(sol);

}